

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

BSDF * __thiscall
pbrt::CoatedDiffuseMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,undefined8 param_2,BSDF *__return_storage_ptr__,
          CoatedDiffuseMaterial *this,TextureEvalContext *param_5,SampledWavelengths *param_6,
          undefined8 *param_7)

{
  uint8_t uVar1;
  undefined2 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  BSDF *pBVar7;
  uintptr_t iptr;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined4 extraout_XMM0_Dc;
  undefined8 uVar14;
  undefined1 auVar11 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar15 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar20;
  undefined1 auVar19 [56];
  undefined1 auVar18 [64];
  undefined1 auVar21 [16];
  SampledSpectrum SVar22;
  float local_2e0;
  UniversalTextureEvaluator local_2d9;
  undefined1 local_2d8 [16];
  float local_2c8;
  float fStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  float local_2b8;
  float fStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  BSDF *local_2a0;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  Float local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  BxDFHandle local_278;
  uintptr_t local_270;
  uintptr_t local_268;
  uintptr_t local_260;
  uintptr_t local_258;
  uintptr_t local_250;
  uintptr_t local_248;
  uintptr_t local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  ulong uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_240 = (this->reflectance).
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
  local_78._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_78._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uVar14 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_68._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_68._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_60._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_60._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_58 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_50 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_48._0_4_ = param_5->dudy;
  uStack_48._4_4_ = param_5->dvdx;
  uStack_40._0_4_ = param_5->dvdy;
  uStack_40._4_4_ = param_5->faceIndex;
  local_218 = *(undefined8 *)(param_6->lambda).values;
  uStack_210 = *(undefined8 *)((param_6->lambda).values + 2);
  uStack_208 = *(undefined8 *)(param_6->pdf).values;
  uStack_200 = *(undefined8 *)((param_6->pdf).values + 2);
  local_2a0 = __return_storage_ptr__;
  uStack_70 = uVar14;
  SVar22 = UniversalTextureEvaluator::operator()
                     (&local_2d9,(SpectrumTextureHandle)&local_240,*param_5,*param_6);
  local_2b8 = SVar22.values.values[0];
  fStack_2b4 = SVar22.values.values[1];
  iStack_2b0 = (int)uVar14;
  iStack_2ac = (int)((ulong)uVar14 >> 0x20);
  local_2c8 = SVar22.values.values[2];
  fStack_2c4 = SVar22.values.values[3];
  uStack_2c0 = (undefined4)param_2;
  uStack_2bc = (undefined4)((ulong)param_2 >> 0x20);
  local_248 = (this->uRoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_b8._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_b8._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_b0 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_a8._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_a8._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_a0._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_a0._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_98 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_90 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_88._0_4_ = param_5->dudy;
  uStack_88._4_4_ = param_5->dvdx;
  uStack_80._0_4_ = param_5->dvdy;
  uStack_80._4_4_ = param_5->faceIndex;
  local_2d8._0_4_ =
       UniversalTextureEvaluator::operator()(&local_2d9,(FloatTextureHandle)&local_248,*param_5);
  local_250 = (this->vRoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_f8._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_f8._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_f0 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_e8._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_e8._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_e0._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_e0._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_d8 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_d0 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_c8._0_4_ = param_5->dudy;
  uStack_c8._4_4_ = param_5->dvdx;
  uStack_c0._0_4_ = param_5->dvdy;
  uStack_c0._4_4_ = param_5->faceIndex;
  auVar11._0_4_ =
       UniversalTextureEvaluator::operator()(&local_2d9,(FloatTextureHandle)&local_250,*param_5);
  auVar11._4_60_ = extraout_var;
  auVar8 = auVar11._0_16_;
  if (this->remapRoughness == true) {
    if ((float)local_2d8._0_4_ < 0.0) {
      fVar10 = sqrtf((float)local_2d8._0_4_);
      auVar8 = ZEXT416((uint)auVar11._0_4_);
    }
    else {
      auVar4 = vsqrtss_avx(ZEXT416((uint)local_2d8._0_4_),ZEXT416((uint)local_2d8._0_4_));
      fVar10 = auVar4._0_4_;
    }
    local_2d8._0_4_ = fVar10;
    if (auVar8._0_4_ < 0.0) {
      local_2e0 = sqrtf(auVar8._0_4_);
      goto LAB_0051320f;
    }
    auVar8 = vsqrtss_avx(auVar8,auVar8);
  }
  local_2e0 = auVar8._0_4_;
LAB_0051320f:
  auVar3._4_4_ = fStack_2b4;
  auVar3._0_4_ = local_2b8;
  auVar3._8_4_ = iStack_2b0;
  auVar3._12_4_ = iStack_2ac;
  auVar8._4_4_ = fStack_2c4;
  auVar8._0_4_ = local_2c8;
  auVar8._8_4_ = uStack_2c0;
  auVar8._12_4_ = uStack_2bc;
  auVar8 = vunpcklpd_avx(auVar3,auVar8);
  uVar20 = vcmpps_avx512vl(auVar8,ZEXT816(0) << 0x40,5);
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  auVar8 = vminps_avx512vl(auVar16,auVar8);
  local_2b8 = (float)((uint)((byte)uVar20 & 1) * auVar8._0_4_);
  fStack_2b4 = (float)((uint)((byte)(uVar20 >> 1) & 1) * auVar8._4_4_);
  iStack_2b0 = (uint)((byte)(uVar20 >> 2) & 1) * auVar8._8_4_;
  iStack_2ac = (uint)((byte)(uVar20 >> 3) & 1) * auVar8._12_4_;
  local_258 = (this->thickness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_138._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_138._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_130 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_128._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_128._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_120._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_120._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_118 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_110 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_108._0_4_ = param_5->dudy;
  uStack_108._4_4_ = param_5->dvdx;
  uStack_100._0_4_ = param_5->dvdy;
  uStack_100._4_4_ = param_5->faceIndex;
  local_2c8 = UniversalTextureEvaluator::operator()
                        (&local_2d9,(FloatTextureHandle)&local_258,*param_5);
  local_260 = (this->eta).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_178._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_178._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_170 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_168._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_168._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_160._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_160._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_158 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_150 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_148._0_4_ = param_5->dudy;
  uStack_148._4_4_ = param_5->dvdx;
  uStack_140._0_4_ = param_5->dvdy;
  uStack_140._4_4_ = param_5->faceIndex;
  uVar20 = 0;
  fStack_2c4 = (float)extraout_XMM0_Db;
  uStack_2c0 = extraout_XMM0_Dc;
  uStack_2bc = extraout_XMM0_Dd;
  local_288 = UniversalTextureEvaluator::operator()
                        (&local_2d9,(FloatTextureHandle)&local_260,*param_5);
  local_268 = (this->albedo).
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
  local_1b8._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_1b8._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_1b0 = *(ulong *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_1a8._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1a8._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1a0._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_1a0._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_198 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_190 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_188._0_4_ = param_5->dudy;
  uStack_188._4_4_ = param_5->dvdx;
  uStack_180._0_4_ = param_5->dvdy;
  uStack_180._4_4_ = param_5->faceIndex;
  local_238 = *(undefined8 *)(param_6->lambda).values;
  uStack_230 = *(undefined8 *)((param_6->lambda).values + 2);
  uStack_228 = *(undefined8 *)(param_6->pdf).values;
  uStack_220 = *(undefined8 *)((param_6->pdf).values + 2);
  auVar15 = ZEXT856(uStack_1b0);
  auVar19 = ZEXT856(uVar20);
  uStack_284 = extraout_XMM0_Db_00;
  uStack_280 = extraout_XMM0_Dc_00;
  uStack_27c = extraout_XMM0_Dd_00;
  SVar22 = UniversalTextureEvaluator::operator()
                     (&local_2d9,(SpectrumTextureHandle)&local_268,*param_5,*param_6);
  auVar18._0_8_ = SVar22.values.values._8_8_;
  auVar18._8_56_ = auVar19;
  auVar12._0_8_ = SVar22.values.values._0_8_;
  auVar12._8_56_ = auVar15;
  auVar8 = vmovlhps_avx(auVar12._0_16_,auVar18._0_16_);
  uVar20 = vcmpps_avx512vl(auVar8,_DAT_005c8010,5);
  auVar17._8_4_ = 0x3f800000;
  auVar17._0_8_ = 0x3f8000003f800000;
  auVar17._12_4_ = 0x3f800000;
  auVar8 = vminps_avx512vl(auVar17,auVar8);
  local_298 = (uint)((byte)uVar20 & 1) * auVar8._0_4_;
  iStack_294 = (uint)((byte)(uVar20 >> 1) & 1) * auVar8._4_4_;
  iStack_290 = (uint)((byte)(uVar20 >> 2) & 1) * auVar8._8_4_;
  iStack_28c = (uint)((byte)(uVar20 >> 3) & 1) * auVar8._12_4_;
  auVar4 = vmaxss_avx(ZEXT416((uint)local_2e0),SUB6416(ZEXT464(0x38d1b717),0));
  local_2d8 = vmaxss_avx(ZEXT416((uint)local_2d8._0_4_),SUB6416(ZEXT464(0x38d1b717),0));
  local_270 = (this->g).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_1f8._0_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_1f8._4_4_ = (param_5->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_1f0 = *(undefined8 *)&(param_5->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_1e8._0_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1e8._4_4_ = (param_5->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1e0._0_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_1e0._4_4_ = (param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1d8 = *(undefined8 *)&(param_5->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1d0 = *(undefined8 *)&(param_5->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_1c8._0_4_ = param_5->dudy;
  uStack_1c8._4_4_ = param_5->dvdx;
  uStack_1c0._0_4_ = param_5->dvdy;
  uStack_1c0._4_4_ = param_5->faceIndex;
  auVar13._0_4_ =
       UniversalTextureEvaluator::operator()(&local_2d9,(FloatTextureHandle)&local_270,*param_5);
  pBVar7 = local_2a0;
  auVar13._4_60_ = extraout_var_00;
  auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar13._0_16_);
  auVar6._4_4_ = uStack_284;
  auVar6._0_4_ = local_288;
  auVar6._8_4_ = uStack_280;
  auVar6._12_4_ = uStack_27c;
  uVar14 = vcmpss_avx512f(auVar6,SUB6416(ZEXT464(0x3f800000),0),0);
  bVar5 = (bool)((byte)uVar14 & 1);
  auVar8 = vinsertps_avx(ZEXT416((uint)bVar5 * 0x3f8020c5 + (uint)!bVar5 * (int)local_288),
                         ZEXT416((uint)local_2d8._0_4_),0x10);
  uVar2 = *(undefined2 *)&this->config;
  uVar1 = (this->config).twoSided;
  uVar14 = vmovlps_avx(auVar8);
  *param_7 = uVar14;
  *(int *)(param_7 + 1) = auVar4._0_4_;
  *(ulong *)((long)param_7 + 0xc) = CONCAT44(fStack_2b4,local_2b8);
  *(ulong *)((long)param_7 + 0x14) = CONCAT44(iStack_2ac,iStack_2b0);
  auVar4._4_4_ = fStack_2c4;
  auVar4._0_4_ = local_2c8;
  auVar4._8_4_ = uStack_2c0;
  auVar4._12_4_ = uStack_2bc;
  auVar8 = vinsertps_avx(auVar4,auVar13._0_16_,0x10);
  auVar21._8_8_ = 0xbf80000000800000;
  auVar21._0_8_ = 0xbf80000000800000;
  uVar20 = vcmpps_avx512vl(auVar8,auVar21,1);
  auVar8 = vinsertps_avx(auVar4,auVar3,0x10);
  bVar5 = (bool)((byte)uVar20 & 1);
  auVar9._0_4_ = (uint)bVar5 * 0x800000 | (uint)!bVar5 * auVar8._0_4_;
  bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
  auVar9._4_4_ = (uint)bVar5 * -0x40800000 | (uint)!bVar5 * auVar8._4_4_;
  bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
  auVar9._8_4_ = (uint)bVar5 * 0x800000 | (uint)!bVar5 * auVar8._8_4_;
  bVar5 = (bool)((byte)(uVar20 >> 3) & 1);
  auVar9._12_4_ = (uint)bVar5 * -0x40800000 | (uint)!bVar5 * auVar8._12_4_;
  uVar14 = vmovlps_avx(auVar9);
  *(undefined8 *)((long)param_7 + 0x1c) = uVar14;
  *(ulong *)((long)param_7 + 0x24) = CONCAT44(iStack_294,local_298);
  *(ulong *)((long)param_7 + 0x2c) = CONCAT44(iStack_28c,iStack_290);
  *(uint8_t *)((long)param_7 + 0x36) = uVar1;
  *(undefined2 *)((long)param_7 + 0x34) = uVar2;
  local_278.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_7 | 0x3000000000000);
  BSDF::BSDF(local_2a0,(Vector3f *)(param_5 + 1),(Normal3f *)&param_5[1].dpdx,
             (Normal3f *)&param_5[1].dpdy,(Vector3f *)&param_5[1].uv,&local_278,1.0);
  return pBVar7;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                              SampledWavelengths &lambda, CoatedDiffuseBxDF *bxdf) const {
        // Initialize diffuse component of plastic material
        SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);

        // Create microfacet distribution _distrib_ for coated diffuse material
        Float urough = texEval(uRoughness, ctx);
        Float vrough = texEval(vRoughness, ctx);
        if (remapRoughness) {
            urough = TrowbridgeReitzDistribution::RoughnessToAlpha(urough);
            vrough = TrowbridgeReitzDistribution::RoughnessToAlpha(vrough);
        }
        TrowbridgeReitzDistribution distrib(urough, vrough);

        Float thick = texEval(thickness, ctx);
        Float e = texEval(eta, ctx);
        SampledSpectrum a = Clamp(texEval(albedo, ctx, lambda), 0, 1);
        Float gg = Clamp(texEval(g, ctx), -1, 1);

        *bxdf = CoatedDiffuseBxDF(DielectricInterfaceBxDF(e, distrib),
                                  IdealDiffuseBxDF(r), thick, a, gg, config);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }